

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_MapAt_Test::~Btree_MapAt_Test(Btree_MapAt_Test *this)

{
  Btree_MapAt_Test *this_local;
  
  ~Btree_MapAt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, MapAt) {
        phmap::btree_map<int, int> map = {{1, 2}, {2, 4}};
        EXPECT_EQ(map.at(1), 2);
        EXPECT_EQ(map.at(2), 4);
        map.at(2) = 8;
        const phmap::btree_map<int, int> &const_map = map;
        EXPECT_EQ(const_map.at(1), 2);
        EXPECT_EQ(const_map.at(2), 8);
#ifdef PHMAP_HAVE_EXCEPTIONS
        EXPECT_THROW(map.at(3), std::out_of_range);
#else
        EXPECT_DEATH(map.at(3), "phmap::btree_map::at");
#endif
    }